

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O3

Hop_Obj_t * Hop_CreateExor(Hop_Man_t *p,int nVars)

{
  Hop_Obj_t *p1;
  int i;
  Hop_Obj_t *p0;
  
  p0 = (Hop_Obj_t *)((ulong)p->pConst1 ^ 1);
  if (0 < nVars) {
    i = 0;
    do {
      p1 = Hop_IthVar(p,i);
      p0 = Hop_Exor(p,p0,p1);
      i = i + 1;
    } while (nVars != i);
  }
  return p0;
}

Assistant:

Hop_Obj_t * Hop_CreateExor( Hop_Man_t * p, int nVars )
{
    Hop_Obj_t * pFunc;
    int i;
    pFunc = Hop_ManConst0( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Hop_Exor( p, pFunc, Hop_IthVar(p, i) );
    return pFunc;
}